

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int xmlParserNsPop(xmlParserCtxtPtr ctxt,int nr)

{
  xmlParserNsBucket *local_40;
  xmlParserNsBucket *bucket;
  xmlHashedString hprefix;
  xmlParserNsExtra *extra;
  xmlChar *prefix;
  int i;
  int nr_local;
  xmlParserCtxtPtr ctxt_local;
  
  prefix._0_4_ = ctxt->nsNr;
  while (prefix._0_4_ = (int)prefix + -1, ctxt->nsNr - nr <= (int)prefix) {
    hprefix._0_8_ = ctxt->nsTab[(int)prefix * 2];
    hprefix.name = (xmlChar *)(ctxt->nsdb->extra + (int)prefix);
    if ((xmlChar *)hprefix._0_8_ == (xmlChar *)0x0) {
      ctxt->nsdb->defaultNsIndex = ((xmlParserNsExtra *)hprefix.name)->oldIndex;
    }
    else {
      local_40 = (xmlParserNsBucket *)0x0;
      bucket._0_4_ = ((xmlParserNsExtra *)hprefix.name)->prefixHashValue;
      xmlParserNsLookup(ctxt,(xmlHashedString *)&bucket,&local_40);
      local_40->index = *(int *)(hprefix.name + 0x14);
    }
  }
  ctxt->nsNr = ctxt->nsNr - nr;
  return nr;
}

Assistant:

static int
xmlParserNsPop(xmlParserCtxtPtr ctxt, int nr)
{
    int i;

    /* assert(nr <= ctxt->nsNr); */

    for (i = ctxt->nsNr - 1; i >= ctxt->nsNr - nr; i--) {
        const xmlChar *prefix = ctxt->nsTab[i * 2];
        xmlParserNsExtra *extra = &ctxt->nsdb->extra[i];

        if (prefix == NULL) {
            ctxt->nsdb->defaultNsIndex = extra->oldIndex;
        } else {
            xmlHashedString hprefix;
            xmlParserNsBucket *bucket = NULL;

            hprefix.name = prefix;
            hprefix.hashValue = extra->prefixHashValue;
            xmlParserNsLookup(ctxt, &hprefix, &bucket);
            /* assert(bucket && bucket->hashValue); */
            bucket->index = extra->oldIndex;
        }
    }

    ctxt->nsNr -= nr;
    return(nr);
}